

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_arg.hpp
# Opt level: O2

void __thiscall Args::MultiArg::process(MultiArg *this,Context *context)

{
  bool bVar1;
  int iVar2;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar2 = (*(this->super_Arg).super_ArgIface._vptr_ArgIface[4])();
  if ((char)iVar2 == '\0') {
    (this->super_Arg).m_isDefined = true;
    this->m_count = this->m_count + 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"Argument \"",&local_91);
    (*(this->super_Arg).super_ArgIface._vptr_ArgIface[3])(&local_90,this);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_30,&local_50,"\" requires value that wasn\'t presented.");
    bVar1 = eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
                      (context,&this->m_values,&local_30,(this->super_Arg).super_ArgIface.m_cmdLine)
    ;
    (this->super_Arg).m_isDefined = bVar1;
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

inline void
MultiArg::process( Context & context )
{
	if( isWithValue() )
	{
		setDefined( eatValues( context, m_values,
			String( SL( "Argument \"" ) ) +
				name() + SL( "\" requires value that wasn't presented." ),
			cmdLine() ) );
	}
	else
	{
		setDefined( true );

		++m_count;
	}
}